

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  Gap *pGVar1;
  Zone *pZVar2;
  ConstPool *pCVar3;
  Node *pNVar4;
  ulong uVar5;
  ConstPool *newNode;
  long lVar6;
  size_t sVar7;
  ConstPool *this_00;
  ulong uVar8;
  ConstPool *this_01;
  Zone *pZVar9;
  ConstPool *pCVar10;
  ConstPool *this_02;
  ConstPool *pCVar11;
  long lVar12;
  bool bVar13;
  Error local_74;
  ConstPool *local_70;
  long local_60;
  
  local_74 = 3;
  pCVar11 = this;
  local_70 = (ConstPool *)dstOffset;
  switch(size) {
  case 1:
    lVar12 = 0;
    break;
  case 2:
    lVar12 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_00164e55_caseD_3;
  case 4:
    lVar12 = 2;
    break;
  case 8:
    lVar12 = 3;
    break;
  default:
    if (size == 0x10) {
      lVar12 = 4;
      break;
    }
    if (size != 0x20) {
      return 3;
    }
    this_01 = (ConstPool *)(this->_tree + 5);
    pNVar4 = Tree::get((Tree *)this_01,data);
    if (pNVar4 == (Node *)0x0) {
      lVar12 = 5;
      goto LAB_00164f77;
    }
    goto LAB_00164ee4;
  }
  this_01 = (ConstPool *)(this->_tree + lVar12);
  newNode = (ConstPool *)data;
  this_02 = this_01;
  pNVar4 = Tree::get((Tree *)this_01,data);
  if (pNVar4 == (Node *)0x0) {
    this_00 = (ConstPool *)0xffffffffffffffff;
    lVar6 = 5;
    do {
      pGVar1 = this->_gaps[lVar12];
      if (pGVar1 != (Gap *)0x0) {
        this_00 = (ConstPool *)pGVar1->_offset;
        sVar7 = pGVar1->_length;
        this->_gaps[lVar12] = pGVar1->_next;
        pGVar1->_next = this->_gapPool;
        this->_gapPool = pGVar1;
        if ((ulong)this_00 % size != 0) goto LAB_00165171;
        sVar7 = sVar7 - size;
        if (sVar7 != 0) {
          newNode = this_00;
          this_02 = this;
          ConstPool_addGap(this,(size_t)this_00,sVar7);
        }
      }
      lVar6 = lVar6 + -1;
    } while (lVar12 != lVar6);
    if (this_00 == (ConstPool *)0xffffffffffffffff) {
LAB_00164f77:
      this_00 = (ConstPool *)this->_size;
      sVar7 = (-size & (long)this_00->_tree + (size - 9)) - (long)this_00;
      if (sVar7 != 0) {
        ConstPool_addGap(this,(size_t)this_00,sVar7);
        this_00 = (ConstPool *)(sVar7 + this->_size);
      }
      this->_size = (long)this_00->_tree + (size - 8);
    }
    this_02 = (ConstPool *)this->_zone;
    pCVar10 = (ConstPool *)(size + 0x18);
    pZVar2 = (Zone *)this_02->_tree[0]._root;
    newNode = (ConstPool *)this_02->_zone;
    if ((ConstPool *)((long)pZVar2 - (long)newNode) < pCVar10) goto LAB_0016517b;
    pZVar9 = (Zone *)((long)&newNode->_tree[0]._length + (long)(pCVar10->_tree + -1));
    this_02->_zone = pZVar9;
    pCVar10 = this_00;
    if (pZVar2 < pZVar9) {
      add();
    }
    while (newNode != (ConstPool *)0x0) {
      newNode->_zone = (Zone *)0x0;
      newNode->_tree[0]._root = (Node *)0x0;
      *(undefined4 *)&newNode->_tree[0]._length = 1;
      *(int *)((long)&newNode->_tree[0]._length + 4) = (int)pCVar10;
      memcpy(&newNode->_tree[0]._dataSize,data,size);
      this_02 = this_01;
      Tree::put((Tree *)this_01,(Node *)newNode);
      uVar5 = pCVar11->_alignment;
      if (pCVar11->_alignment <= size) {
        uVar5 = size;
      }
      pCVar11->_alignment = uVar5;
      local_70->_zone = (Zone *)pCVar10;
      if (size < 5) {
        return 0;
      }
      local_60 = 1;
      this_00 = pCVar10;
      lVar6 = lVar12;
      uVar5 = size;
      while (lVar12 = lVar6 + -1, size = uVar5, lVar6 != 0) {
        size = uVar5 >> 1;
        local_60 = local_60 * 2;
        if (local_60 != 0) {
          this_00 = (ConstPool *)(this->_tree + lVar6 + -1);
          local_70 = (ConstPool *)(size + 0x18);
          uVar8 = (ulong)pCVar10 & 0xffffffff;
          this_01 = (ConstPool *)data;
          lVar12 = local_60;
LAB_001650bd:
          newNode = this_01;
          this_02 = this_00;
          pNVar4 = Tree::get((Tree *)this_00,this_01);
          if (pNVar4 != (Node *)0x0) goto LAB_00165131;
          this_02 = (ConstPool *)pCVar11->_zone;
          pZVar2 = (Zone *)this_02->_tree[0]._root;
          pCVar3 = (ConstPool *)this_02->_zone;
          if ((ConstPool *)((long)pZVar2 - (long)pCVar3) < local_70) {
            newNode = (ConstPool *)Zone::_alloc((Zone *)this_02,(size_t)local_70);
LAB_001650f4:
            if (newNode != (ConstPool *)0x0) {
              newNode->_zone = (Zone *)0x0;
              newNode->_tree[0]._root = (Node *)0x0;
              *(undefined4 *)&newNode->_tree[0]._length = 0x80000001;
              *(int *)((long)&newNode->_tree[0]._length + 4) = (int)uVar8;
              memcpy(&newNode->_tree[0]._dataSize,this_01,size);
            }
            this_02 = this_00;
            Tree::put((Tree *)this_00,(Node *)newNode);
            goto LAB_00165131;
          }
          pZVar9 = (Zone *)((long)&local_70->_tree[0]._length + (long)(pCVar3->_tree + -1));
          this_02->_zone = pZVar9;
          newNode = pCVar3;
          if (pZVar9 <= pZVar2) goto LAB_001650f4;
          newNode = local_70;
          add();
          pCVar11 = pCVar3;
LAB_00165171:
          add();
          break;
        }
LAB_00165148:
        bVar13 = uVar5 < 10;
        lVar6 = lVar6 + -1;
        uVar5 = size;
        if (bVar13) {
          return 0;
        }
      }
      add();
      pCVar10 = newNode;
LAB_0016517b:
      newNode = (ConstPool *)Zone::_alloc((Zone *)this_02,(size_t)pCVar10);
      pCVar10 = this_00;
    }
    local_74 = 1;
  }
  else {
LAB_00164ee4:
    local_74 = 0;
    *dstOffset = (ulong)pNVar4->_offset;
  }
switchD_00164e55_caseD_3:
  return local_74;
LAB_00165131:
  this_01 = (ConstPool *)((long)this_01->_tree + (size - 8));
  uVar8 = (ulong)(uint)((int)uVar8 + (int)size);
  lVar12 = lVar12 + -1;
  if (lVar12 == 0) goto LAB_00165148;
  goto LAB_001650bd;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~static_cast<size_t>(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapLength = gap->_length;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Utils::isAligned<size_t>(offset, size));

      gapLength -= size;
      if (gapLength > 0)
        ConstPool_addGap(this, gapOffset, gapLength);
    }

    gapIndex++;
  }

  if (offset == ~static_cast<size_t>(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Utils::alignDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorNoHeapMemory);

  _tree[treeIndex].put(node);
  _alignment = std::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].put(node);
    }
  }

  return kErrorOk;
}